

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonIO.hh
# Opt level: O2

void __thiscall avro::json::JsonGenerator::sep(JsonGenerator *this)

{
  size_t in_RCX;
  void *in_RDX;
  
  if (this->top == stArray0) {
    this->top = stArrayN;
  }
  else if (this->top == stArrayN) {
    StreamWriter::write(&this->out_,0x2c,in_RDX,in_RCX);
    return;
  }
  return;
}

Assistant:

void sep() {
        if (top == stArrayN) {
            out_.write(',');
        } else if (top == stArray0) {
            top = stArrayN;
        }
    }